

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

int __thiscall SPSUnit::mvc_vui_parameters_extension(SPSUnit *this)

{
  BitStreamReader *this_00;
  vector<HRDParams,_std::allocator<HRDParams>_> *this_01;
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  uint uVar8;
  pointer pHVar9;
  ulong uVar10;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vui_mvc_temporal_id;
  uint local_64;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_40;
  vector<HRDParams,_std::allocator<HRDParams>_> *local_38;
  
  this_00 = &(this->super_NALUnit).bitReader;
  uVar8 = 0xffffffff;
  do {
    bVar3 = BitStreamReader::getBit(this_00);
    uVar8 = uVar8 + 1;
  } while (!bVar3);
  if (0x20 < uVar8) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_0023ca88;
    __cxa_throw(puVar7,&BitStreamException::typeinfo,std::exception::~exception);
  }
  local_64 = 1;
  uVar4 = BitStreamReader::getBits(this_00,uVar8);
  uVar4 = uVar4 + (1 << ((byte)uVar8 & 0x1f));
  if (uVar4 < 0x401) {
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar10 = (ulong)uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_58,uVar10);
    std::vector<int,_std::allocator<int>_>::resize(&this->mvcHrdParamsBitPos,uVar10);
    this_01 = &this->mvcNalHrdParams;
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize(this_01,uVar10);
    local_38 = &this->mvcVclHrdParams;
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize(local_38,uVar10);
    if (uVar4 == 0) {
      local_64 = 0;
    }
    else {
      local_64 = 1;
      uVar11 = 0;
      local_40 = uVar10;
      do {
        uVar8 = BitStreamReader::getBits(this_00,3);
        local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = (uchar)uVar8;
        uVar8 = 0xffffffff;
        do {
          bVar3 = BitStreamReader::getBit(this_00);
          uVar8 = uVar8 + 1;
        } while (!bVar3);
        if (0x20 < uVar8) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = &PTR__exception_0023ca88;
          __cxa_throw(puVar7,&BitStreamException::typeinfo,std::exception::~exception);
        }
        uVar4 = BitStreamReader::getBits(this_00,uVar8);
        uVar4 = uVar4 + (1 << ((byte)uVar8 & 0x1f));
        if (0x400 < uVar4) break;
        if (uVar4 != 0) {
          uVar10 = 0;
          do {
            uVar8 = 0xffffffff;
            do {
              bVar3 = BitStreamReader::getBit(this_00);
              uVar8 = uVar8 + 1;
            } while (!bVar3);
            if (0x20 < uVar8) {
              puVar7 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar7 = &PTR__exception_0023ca88;
              __cxa_throw(puVar7,&BitStreamException::typeinfo,std::exception::~exception);
            }
            uVar5 = BitStreamReader::getBits(this_00,uVar8);
            if ((-1 << ((byte)uVar8 & 0x1f)) - uVar5 < 0xfffffc00) goto LAB_001c27b1;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar4);
        }
        bVar3 = BitStreamReader::getBit(this_00);
        if (bVar3) {
          BitStreamReader::skipBits(this_00,0x20);
          BitStreamReader::skipBits(this_00,0x20);
          BitStreamReader::skipBit(this_00);
        }
        (this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] =
             ((*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
              *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8 -
             (this->super_NALUnit).bitReader.m_bitLeft) + 0x40;
        bVar3 = BitStreamReader::getBit(this_00);
        pHVar9 = (this_01->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar9[uVar11].isPresent = bVar3;
        if (bVar3) {
          iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
          uVar8 = (this->super_NALUnit).bitReader.m_bitLeft;
          iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer;
          iVar6 = hrd_parameters(this,pHVar9 + uVar11);
          if (iVar6 != 0) break;
          (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11].bitLen =
               (((iVar1 - iVar2) * 8 + uVar8) - (this->super_NALUnit).bitReader.m_bitLeft) +
               (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
               *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
        }
        bVar3 = BitStreamReader::getBit(this_00);
        pHVar9 = (local_38->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar9[uVar11].isPresent = bVar3;
        if (bVar3) {
          iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
          uVar8 = (this->super_NALUnit).bitReader.m_bitLeft;
          iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer;
          iVar6 = hrd_parameters(this,pHVar9 + uVar11);
          if (iVar6 != 0) break;
          pHVar9 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pHVar9[uVar11].bitLen =
               (((iVar1 - iVar2) * 8 + uVar8) - (this->super_NALUnit).bitReader.m_bitLeft) +
               (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
               *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
        }
        if (((this_01->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11].isPresent != false) ||
           (pHVar9[uVar11].isPresent == true)) {
          BitStreamReader::skipBit(this_00);
        }
        BitStreamReader::skipBit(this_00);
        uVar11 = uVar11 + 1;
        local_64 = (uint)(uVar11 < local_40);
      } while (uVar11 != local_40);
    }
LAB_001c27b1:
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return local_64;
}

Assistant:

int SPSUnit::mvc_vui_parameters_extension()
{
    const unsigned vui_mvc_num_ops = extractUEGolombCode() + 1;
    if (vui_mvc_num_ops > 1 << 10)
        return 1;
    std::vector<uint8_t> vui_mvc_temporal_id;
    vui_mvc_temporal_id.resize(vui_mvc_num_ops);
    mvcHrdParamsBitPos.resize(vui_mvc_num_ops);
    mvcNalHrdParams.resize(vui_mvc_num_ops);
    mvcVclHrdParams.resize(vui_mvc_num_ops);

    for (size_t i = 0; i < vui_mvc_num_ops; i++)
    {
        vui_mvc_temporal_id[i] = bitReader.getBits<uint8_t>(3);
        const unsigned vui_mvc_num_target_output_views = extractUEGolombCode() + 1;
        if (vui_mvc_num_target_output_views > 1 << 10)
            return 1;
        for (size_t j = 0; j < vui_mvc_num_target_output_views; j++)
            if (extractUEGolombCode() >= 1 << 10)  // vui_mvc_view_id[ i ][ j ]
                return 1;

        if (bitReader.getBit())  // vui_mvc_timing_info_present_flag[ i ]
        {
            bitReader.skipBits(32);  // vui_mvc_num_units_in_tick[i]
            bitReader.skipBits(32);  // vui_mvc_time_scale[ i ]
            bitReader.skipBit();     // vui_mvc_fixed_frame_rate_flag[ i ]
        }

        mvcHrdParamsBitPos[i] = bitReader.getBitsCount() + 32;
        mvcNalHrdParams[i].isPresent = bitReader.getBit();
        if (mvcNalHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcNalHrdParams[i]) != 0)
                return 1;
            mvcNalHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        mvcVclHrdParams[i].isPresent = bitReader.getBit();
        if (mvcVclHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcVclHrdParams[i]) != 0)
                return 1;
            mvcVclHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        if (mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
            bitReader.skipBit();  // vui_mvc_low_delay_hrd_flag[i]
        bitReader.skipBit();      // vui_mvc_pic_struct_present_flag[i]
    }
    return 0;
}